

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O0

int nni_lmq_get(nni_lmq *lmq,nng_msg **mp)

{
  size_t sVar1;
  nng_msg *pnVar2;
  nng_msg *msg;
  nng_msg **mp_local;
  nni_lmq *lmq_local;
  
  if (lmq->lmq_len == 0) {
    lmq_local._4_4_ = 8;
  }
  else {
    sVar1 = lmq->lmq_get;
    lmq->lmq_get = sVar1 + 1;
    pnVar2 = lmq->lmq_msgs[sVar1];
    lmq->lmq_get = lmq->lmq_mask & lmq->lmq_get;
    lmq->lmq_len = lmq->lmq_len - 1;
    *mp = pnVar2;
    lmq_local._4_4_ = 0;
  }
  return lmq_local._4_4_;
}

Assistant:

int
nni_lmq_get(nni_lmq *lmq, nng_msg **mp)
{
	nng_msg *msg;
	if (lmq->lmq_len == 0) {
		return (NNG_EAGAIN);
	}
	msg = lmq->lmq_msgs[lmq->lmq_get++];
	lmq->lmq_get &= lmq->lmq_mask;
	lmq->lmq_len--;
	*mp = msg;
	return (0);
}